

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
iu_FilePath_x_iutest_x_RemoveDirectoryName_Test::Body
          (iu_FilePath_x_iutest_x_RemoveDirectoryName_Test *this)

{
  iuFilePath *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  AssertionResult local_208;
  iuFilePath local_1e0;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::detail::iuFilePath::iuFilePath(&local_1e0,"test.exe");
  iutest::detail::iuFilePath::RemoveDirectoryName((iuFilePath *)&local_190,&local_1e0);
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_208,(internal *)"\"test.exe\"","path.RemoveDirectoryName()","test.exe",
             (char (*) [9])&local_190,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xd4,local_208.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  iutest::detail::iuFilePath::iuFilePath(&local_1e0,"test/test.exe");
  iutest::detail::iuFilePath::RemoveDirectoryName((iuFilePath *)&local_190,&local_1e0);
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_208,(internal *)"\"test.exe\"","path.RemoveDirectoryName()","test.exe",
             (char (*) [9])&local_190,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xd8,local_208.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  return;
}

Assistant:

IUTEST(FilePath, RemoveDirectoryName)
{
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveDirectoryName());
    }
    {
        ::iutest::internal::FilePath path("test/test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveDirectoryName());
    }
}